

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O1

void testSendRecv(uint64_t batchSize,uint64_t sendInterval)

{
  pointer pbVar1;
  uint64_t uVar2;
  _Head_base<0UL,_Statsd::UDPSender_*,_false> this;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  runtime_error *this_00;
  ulong uVar6;
  string *message_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  bool bVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  thread server;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  StatsdServer mock_server;
  StatsdClient client;
  allocator_type local_1509;
  string local_1508;
  undefined1 local_14e8 [8];
  bool local_14e0;
  undefined1 local_14d8 [16];
  undefined8 local_14c8 [2];
  undefined1 local_14b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14a8;
  undefined1 local_1498 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1488;
  thread local_1470;
  undefined8 *local_1468;
  undefined8 *local_1460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1458;
  uint64_t local_1438;
  ulong local_1430;
  StatsdServer local_1428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1400;
  undefined1 local_13e8 [32];
  _Head_base<0UL,_Statsd::UDPSender_*,_false> local_13c8;
  unsigned_long local_13c0;
  ulong auStack_13b8 [623];
  size_t local_40;
  
  Statsd::StatsdServer::StatsdServer(&local_1428,0x1fbd);
  local_14e8 = (undefined1  [8])&local_1458;
  local_1458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_13e8._0_8_ = &local_1428;
  std::thread::
  thread<void(&)(Statsd::StatsdServer&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),std::reference_wrapper<Statsd::StatsdServer>,std::reference_wrapper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            (&local_1470,mock,(reference_wrapper<Statsd::StatsdServer> *)local_13e8,
             (reference_wrapper<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_14e8);
  local_14e8 = (undefined1  [8])local_14d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"localhost","");
  local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1508,"sendRecv.","");
  Statsd::StatsdClient::StatsdClient
            ((StatsdClient *)local_13e8,(string *)local_14e8,0x1fbd,&local_1508,batchSize,
             sendInterval,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
    operator_delete(local_1508._M_dataplus._M_p);
  }
  if (local_14e8 != (undefined1  [8])local_14d8) {
    operator_delete((void *)local_14e8);
  }
  local_14e8 = (undefined1  [8])local_14d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
  throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
  local_1438 = sendInterval;
  if (local_14e8 != (undefined1  [8])local_14d8) {
    operator_delete((void *)local_14e8);
  }
  local_1468 = local_14c8;
  uVar6 = 0;
  local_1460 = local_1468;
  do {
    local_14e8 = (undefined1  [8])local_14d8;
    local_1430 = uVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"coco","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,(string *)local_14e8,1,"c",1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[18]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [18])"sendRecv.coco:1|c");
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"kiki","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,(string *)local_14e8,-1,"c",1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[19]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [19])"sendRecv.kiki:-1|c");
    local_13c0 = 0x13;
    uVar6 = 0x13;
    lVar4 = 6;
    do {
      uVar6 = (ulong)((((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar4) - 5);
      *(ulong *)(local_13e8 + lVar4 * 8) = uVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x275);
    local_40 = 0x270;
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"toto","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,(string *)local_14e8,2,"c",0.1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[24]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [24])"sendRecv.toto:2|c|@0.10");
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"popo","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,(string *)local_14e8,9,"c",0.1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"titi","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,(string *)local_14e8,3,"g",1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[18]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [18])"sendRecv.titi:3|g");
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"titifloat","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<double>
              ((StatsdClient *)local_13e8,(string *)local_14e8,-123.456789,"g",1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[30]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [30])"sendRecv.titifloat:-123.457|g");
    local_13c0 = 0x13;
    uVar6 = 0x13;
    lVar4 = 6;
    do {
      uVar6 = (ulong)((((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar4) - 5);
      *(ulong *)(local_13e8 + lVar4 * 8) = uVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x275);
    local_40 = 0x270;
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"myTiming","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<unsigned_int>
              ((StatsdClient *)local_13e8,(string *)local_14e8,2,"ms",0.1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[29]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [29])"sendRecv.myTiming:2|ms|@0.10");
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"tutu","");
    local_1508._M_dataplus._M_p = (pointer)0x0;
    local_1508._M_string_length = 0;
    local_1508.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::send<unsigned_int>
              ((StatsdClient *)local_13e8,(string *)local_14e8,0x4cb,"s",2.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1508);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[21]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [21])"sendRecv.tutu:1227|s");
    local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1508,anon_var_dwarf_8fb4,anon_var_dwarf_8fb4 + 0xe);
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"liegt","");
    local_14c8[0] = (pointer)local_14b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14c8,"im","");
    local_14a8._M_allocated_capacity = (size_type)local_1498;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_14b8 + 0x10),anon_var_dwarf_8ffc + 0x28,anon_var_dwarf_8ffc + 0x2d);
    __l._M_len = 3;
    __l._M_array = (string *)local_14e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1400,__l,&local_1509);
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,&local_1508,0x14d,"g",1.0,&local_1400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1400);
    lVar4 = 0;
    do {
      if (local_1498 + lVar4 != *(undefined1 **)(local_1498 + lVar4 + -0x10)) {
        operator_delete(*(undefined1 **)(local_1498 + lVar4 + -0x10));
      }
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
      operator_delete(local_1508._M_dataplus._M_p);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[46]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               &anon_var_dwarf_8ffc);
    local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1508,"foo","");
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"bar","");
    local_14c8[0] = (pointer)local_14b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14c8,"baz","");
    __l_00._M_len = 2;
    __l_00._M_array = (string *)local_14e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1400,__l_00,&local_1509);
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,&local_1508,-0x2a,"c",0.9,&local_1400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1400);
    lVar4 = 0;
    do {
      if ((undefined1 *)((long)&(((pointer)local_14b8)->_M_dataplus)._M_p + lVar4) !=
          *(undefined1 **)((long)local_14c8 + lVar4)) {
        operator_delete(*(undefined1 **)((long)local_14c8 + lVar4));
      }
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
      operator_delete(local_1508._M_dataplus._M_p);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[34]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [34])"sendRecv.foo:-42|c|@0.90|#bar,baz");
    local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1508,"custom_metric_type","");
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"tag1","");
    local_14c8[0] = (pointer)local_14b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14c8,"tag2","");
    __l_01._M_len = 2;
    __l_01._M_array = (string *)local_14e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1400,__l_01,&local_1509);
    Statsd::StatsdClient::send<int>
              ((StatsdClient *)local_13e8,&local_1508,0x162e,"cust",0.95,&local_1400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1400);
    lVar4 = 0;
    do {
      if ((undefined1 *)((long)&(((pointer)local_14b8)->_M_dataplus)._M_p + lVar4) !=
          *(undefined1 **)((long)local_14c8 + lVar4)) {
        operator_delete(*(undefined1 **)((long)local_14c8 + lVar4));
      }
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
      operator_delete(local_1508._M_dataplus._M_p);
    }
    local_14e8 = (undefined1  [8])local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
    throwOnError<Statsd::StatsdClient>((StatsdClient *)local_13e8,true,(string *)local_14e8);
    if (local_14e8 != (undefined1  [8])local_14d8) {
      operator_delete((void *)local_14e8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[55]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1488,
               (char (*) [55])"sendRecv.custom_metric_type:5678|cust|@0.95|#tag1,tag2");
    uVar3 = (int)local_1430 + 1;
    uVar6 = (ulong)uVar3;
  } while (uVar3 != 3);
  local_14e8 = (undefined1  [8])local_14d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"DONE","");
  local_1508._M_dataplus._M_p = (pointer)0x0;
  local_1508._M_string_length = 0;
  local_1508.field_2._M_allocated_capacity = 0;
  Statsd::StatsdClient::send<unsigned_int>
            ((StatsdClient *)local_13e8,(string *)local_14e8,0,"ms",1.0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1508);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1508);
  uVar2 = local_1438;
  if (local_14e8 != (undefined1  [8])local_14d8) {
    operator_delete((void *)local_14e8);
  }
  this._M_head_impl = local_13c8._M_head_impl;
  if (uVar2 == 0) {
    bVar8 = ((local_13c8._M_head_impl)->m_batchingThread)._M_id._M_thread == 0;
    if (bVar8) {
      local_14e8 = (undefined1  [8])0x0;
    }
    else {
      local_14e8 = (undefined1  [8])&(local_13c8._M_head_impl)->m_batchingMutex;
      local_14e0 = false;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_14e8);
    }
    local_14e0 = !bVar8;
    message_00 = ((this._M_head_impl)->m_batchingMessageQueue).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((this._M_head_impl)->m_batchingMessageQueue).
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != message_00) {
      do {
        Statsd::UDPSender::sendToDaemon(this._M_head_impl,message_00);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(&(this._M_head_impl)->m_batchingMessageQueue);
        message_00 = ((this._M_head_impl)->m_batchingMessageQueue).
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (((this._M_head_impl)->m_batchingMessageQueue).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != message_00);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_14e8);
  }
  std::thread::join();
  if (((long)local_1458.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_1458.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
       (long)local_1488.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_1488.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) &&
     (bVar8 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (local_1458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_1458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         local_1488.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start), bVar8)) {
    if ((__uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>)
        local_13c8._M_head_impl !=
        (__uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>)0x0) {
      std::default_delete<Statsd::UDPSender>::operator()
                ((default_delete<Statsd::UDPSender> *)&local_13c8,local_13c8._M_head_impl);
    }
    local_13c8._M_head_impl = (UDPSender *)0x0;
    if ((StatsdServer *)local_13e8._0_8_ != (StatsdServer *)(local_13e8 + 0x10)) {
      operator_delete((void *)local_13e8._0_8_);
    }
    if (local_1470._M_id._M_thread == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1488);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1458);
      Statsd::StatsdServer::~StatsdServer(&local_1428);
      return;
    }
    std::terminate();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unexpected stats received by server, got:",0x29);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  pbVar1 = local_1458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = local_1458.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"But we expected:",0x10);
  std::endl<char,std::char_traits<char>>(poVar5);
  pbVar1 = local_1488.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = local_1488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected stats");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void testSendRecv(uint64_t batchSize, uint64_t sendInterval) {
    StatsdServer mock_server;
    std::vector<std::string> messages, expected;
    std::thread server(mock, std::ref(mock_server), std::ref(messages));

    // Set a new config that has the client send messages to a proper address that can be resolved
    StatsdClient client("localhost", 8125, "sendRecv.", batchSize, sendInterval, 3);
    throwOnError(client);

    // TODO: I forget if we need to wait for the server to be ready here before sending the first stats
    //  is there a race condition where the client sending before the server binds would drop that clients message

    for (int i = 0; i < 3; ++i) {
        // Increment "coco"
        client.increment("coco");
        throwOnError(client);
        expected.emplace_back("sendRecv.coco:1|c");

        // Decrement "kiki"
        client.decrement("kiki");
        throwOnError(client);
        expected.emplace_back("sendRecv.kiki:-1|c");

        // Adjusts "toto" by +2
        client.seed(19);  // this seed gets a hit on the first call
        client.count("toto", 2, 0.1f);
        throwOnError(client);
        expected.emplace_back("sendRecv.toto:2|c|@0.10");

        // Gets "sampled out" by the random number generator
        client.count("popo", 9, 0.1f);
        throwOnError(client);

        // Record a gauge "titi" to 3
        client.gauge("titi", 3);
        throwOnError(client);
        expected.emplace_back("sendRecv.titi:3|g");

        // Record a gauge "titifloat" to -123.456789 with precision 3
        client.gauge("titifloat", -123.456789);
        throwOnError(client);
        expected.emplace_back("sendRecv.titifloat:-123.457|g");

        // Record a timing of 2ms for "myTiming"
        client.seed(19);
        client.timing("myTiming", 2, 0.1f);
        throwOnError(client);
        expected.emplace_back("sendRecv.myTiming:2|ms|@0.10");

        // Send a set with 1227 total uniques
        client.set("tutu", 1227, 2.0f);
        throwOnError(client);
        expected.emplace_back("sendRecv.tutu:1227|s");

        // Gauge but with tags
        client.gauge("dr.röstigrabe", 333, 1.f, {"liegt", "im", "weste"});
        throwOnError(client);
        expected.emplace_back("sendRecv.dr.röstigrabe:333|g|#liegt,im,weste");

        // All the things
        client.count("foo", -42, .9f, {"bar", "baz"});
        throwOnError(client);
        expected.emplace_back("sendRecv.foo:-42|c|@0.90|#bar,baz");

        // Custom metric type should pass through all params
        client.custom("custom_metric_type", 5678, "cust", .95f, {"tag1", "tag2"});
        throwOnError(client);
        expected.emplace_back("sendRecv.custom_metric_type:5678|cust|@0.95|#tag1,tag2");
    }

    // Signal the mock server we are done
    client.timing("DONE", 0);

    // If manual flushing do it now
    if (sendInterval == 0) {
        client.flush();
    }

    // Wait for the server to stop
    server.join();

    // Make sure we get the exactly correct output
    if (messages != expected) {
        std::cerr << "Unexpected stats received by server, got:" << std::endl;
        for (const auto& message : messages) {
            std::cerr << message << std::endl;
        }
        std::cerr << std::endl << "But we expected:" << std::endl;
        for (const auto& message : expected) {
            std::cerr << message << std::endl;
        }
        throw std::runtime_error("Unexpected stats");
    }
}